

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

void __thiscall VCFace::VCFace(VCFace *this,int v1,int v2,int v3,VertexGroup *vg,VCCluster *c)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar10;
  Vec3d *B;
  Scalar tmp;
  undefined4 uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  Vector4d plane;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_118;
  double local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  Vec3d local_d8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [24];
  Vec3d local_90;
  double local_78;
  double dStack_70;
  double local_68 [2];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  
  this->v1 = v1;
  this->v2 = v2;
  this->v3 = v3;
  p_Var1 = &(this->neighbor)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cluster = c;
  B = (Vec3d *)(&vg->field_0x8 + (long)v1 * 0x50);
  operator-((Vec3d *)(&vg->field_0x8 + (long)v2 * 0x50),B);
  local_e8._8_8_ = 0;
  local_e8._0_8_ = local_d8.x;
  local_f8 = local_d8.y;
  uStack_f0 = local_d8.z;
  Vec3d::~Vec3d(&local_d8);
  operator-((Vec3d *)(&vg->field_0x8 + (long)v3 * 0x50),B);
  local_48 = local_d8.x;
  uStack_40 = 0;
  uStack_50 = local_e8._0_4_;
  uStack_4c = local_e8._4_4_;
  local_58 = (undefined4)uStack_f0;
  uStack_54 = uStack_f0._4_4_;
  local_b8 = local_d8.x * local_f8;
  uStack_b0 = 0;
  local_a8._0_8_ = local_d8.y;
  local_a8._8_8_ = local_d8.z;
  Vec3d::~Vec3d(&local_d8);
  dVar8 = (double)local_a8._8_8_ * local_f8 -
          (double)CONCAT44(uStack_54,local_58) * (double)local_a8._0_8_;
  dVar9 = local_48 * uStack_f0 - (double)CONCAT44(uStack_4c,uStack_50) * (double)local_a8._8_8_;
  dVar12 = local_e8._0_8_ * (double)local_a8._0_8_ - local_b8;
  local_f8 = B->x;
  uStack_f0 = *(double *)(&vg->field_0x10 + (long)v1 * 0x50);
  local_b8 = *(double *)(&vg->field_0x18 + (long)v1 * 0x50);
  auVar13._8_8_ = dVar9;
  auVar13._0_8_ = dVar8;
  dVar8 = SQRT(dVar9 * dVar9 + dVar12 * dVar12 + dVar8 * dVar8);
  auVar3._8_4_ = SUB84(dVar8,0);
  auVar3._0_8_ = dVar8;
  auVar3._12_4_ = (int)((ulong)dVar8 >> 0x20);
  local_a8._0_16_ = divpd(auVar13,auVar3);
  uVar11 = local_e8._12_4_;
  *(undefined1 (*) [16])
   (this->normal).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
   array = local_a8._0_16_;
  local_e8._8_4_ = local_e8._8_4_;
  local_e8._0_8_ = dVar12 / dVar8;
  local_e8._12_4_ = uVar11;
  (this->normal).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = dVar12 / dVar8;
  this->area = dVar8 * 0.5;
  operator+(B,(Vec3d *)(&vg->field_0x8 + (long)v2 * 0x50));
  operator+(&local_90,(Vec3d *)(&vg->field_0x8 + (long)v3 * 0x50));
  local_38 = 3.0;
  operator/((Vec3d *)&local_118,&local_38);
  (this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = local_d8.x;
  (this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = local_d8.y;
  (this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = local_d8.z;
  Vec3d::~Vec3d(&local_d8);
  Vec3d::~Vec3d((Vec3d *)&local_118);
  Vec3d::~Vec3d(&local_90);
  local_78 = (double)local_a8._0_8_;
  dStack_70 = (double)local_a8._8_8_;
  local_68[0] = (double)local_e8._0_8_;
  local_118.m_row = 0;
  local_118.m_col = 1;
  local_118.m_currentBlockRows = 1;
  local_d8.x = (double)local_a8._0_8_;
  local_118.m_xpr = (Matrix<double,_4,_1,_0,_4,_1> *)&local_d8;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                      (&local_118,&dStack_70);
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                      (pCVar10,local_68);
  local_90.x = -(uStack_f0 * dStack_70 + local_b8 * local_68[0] + local_f8 * local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar10,&local_90.x);
  if ((local_118.m_currentBlockRows + local_118.m_row == 4) && (local_118.m_col == 1)) {
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = local_d8.x * local_d8.x;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = local_d8.y * local_d8.x;
    auVar4._8_4_ = SUB84(local_d8.x * dStack_c0,0);
    auVar4._0_8_ = local_d8.x * local_d8.z;
    auVar4._12_4_ = (int)((ulong)(local_d8.x * dStack_c0) >> 0x20);
    *(undefined1 (*) [16])
     ((this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
     + 2) = auVar4;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = local_d8.x * local_d8.y;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = local_d8.y * local_d8.y;
    auVar5._8_4_ = SUB84(local_d8.y * dStack_c0,0);
    auVar5._0_8_ = local_d8.y * local_d8.z;
    auVar5._12_4_ = (int)((ulong)(local_d8.y * dStack_c0) >> 0x20);
    *(undefined1 (*) [16])
     ((this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
     + 6) = auVar5;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
         = local_d8.x * local_d8.z;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
         = local_d8.y * local_d8.z;
    auVar6._8_4_ = SUB84(local_d8.z * dStack_c0,0);
    auVar6._0_8_ = local_d8.z * local_d8.z;
    auVar6._12_4_ = (int)((ulong)(local_d8.z * dStack_c0) >> 0x20);
    *(undefined1 (*) [16])
     ((this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
     + 10) = auVar6;
    auVar2._8_4_ = SUB84(local_d8.y * dStack_c0,0);
    auVar2._0_8_ = local_d8.x * dStack_c0;
    auVar2._12_4_ = (int)((ulong)(local_d8.y * dStack_c0) >> 0x20);
    *(undefined1 (*) [16])
     ((this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
     + 0xc) = auVar2;
    auVar7._8_4_ = SUB84(dStack_c0 * dStack_c0,0);
    auVar7._0_8_ = dStack_c0 * local_d8.z;
    auVar7._12_4_ = (int)((ulong)(dStack_c0 * dStack_c0) >> 0x20);
    *(undefined1 (*) [16])
     ((this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
     + 0xe) = auVar7;
    VCCluster::addItem(c,this);
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
               );
}

Assistant:

VCFace::VCFace(int v1, int v2, int v3, VertexGroup* vg, VCCluster* c)
	:v1(v1), v2(v2), v3(v3), cluster(c)
{
	Vertex* p1 = &vg->group[v1];
	Vertex* p2 = &vg->group[v2];
	Vertex* p3 = &vg->group[v3];
	Vector3d u = VCMyvecToEigen(p2->pos - p1->pos);
	Vector3d v = VCMyvecToEigen(p3->pos - p1->pos);
	Vector3d n(u.cross(v)), a(VCMyvecToEigen(p1->pos));
	normal = n.normalized();
	area = 0.5 * sqrt(n.dot(n));
	center = VCMyvecToEigen((p1->pos + p2->pos + p3->pos) / 3);
	n.normalize();
	Vector4d plane;
	plane << n.x() , n.y() , n.z() ,-n.dot(a); 
	E = plane * plane.transpose();
	c->addItem(this);
}